

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

wchar_t yes(char *fmt,...)

{
  char in_AL;
  ssize_t sVar1;
  ushort **ppuVar2;
  undefined8 in_RCX;
  byte *pbVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char buff [32];
  va_list ap;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  pbVar3 = (byte *)buff;
  ap[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 8;
  ap[0].fp_offset = 0x30;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  vfprintf(_stderr,fmt,ap);
  fwrite(" (y/N)? ",8,1,_stderr);
  fflush(_stderr);
  sVar1 = read(2,buff,0x1f);
  if (sVar1 < 0) {
    fwrite("Keyboard read failed\n",0x15,1,_stderr);
    exit(1);
  }
  if ((sVar1 != 0) && (buff[sVar1] = '\0', buff[0] != '\0')) {
    ppuVar2 = __ctype_b_loc();
    do {
      pbVar3 = pbVar3 + 1;
      if ((*(byte *)((long)*ppuVar2 + (ulong)(byte)buff[0] * 2 + 1) & 0x20) == 0) {
        if (buff[0] != 0x4e) {
          if (buff[0] == 0x59) {
            return L'\x01';
          }
          if (buff[0] == 0x79) {
            return L'\x01';
          }
        }
        return L'\0';
      }
      buff[0] = *pbVar3;
    } while (buff[0] != 0);
  }
  return L'\0';
}

Assistant:

int
yes(const char *fmt, ...)
{
	char buff[32];
	char *p;
	ssize_t l;

	va_list ap;
	va_start(ap, fmt);
	vfprintf(stderr, fmt, ap);
	va_end(ap);
	fprintf(stderr, " (y/N)? ");
	fflush(stderr);

	l = read(2, buff, sizeof(buff) - 1);
	if (l < 0) {
	  fprintf(stderr, "Keyboard read failed\n");
	  exit(1);
	}
	if (l == 0)
		return (0);
	buff[l] = 0;

	for (p = buff; *p != '\0'; p++) {
		if (isspace((unsigned char)*p))
			continue;
		switch(*p) {
		case 'y': case 'Y':
			return (1);
		case 'n': case 'N':
			return (0);
		default:
			return (0);
		}
	}

	return (0);
}